

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# input_api.cc
# Opt level: O1

string * __thiscall
re2c::InputAPI::expr_lessthan_one_abi_cxx11_(string *__return_storage_ptr__,InputAPI *this)

{
  type_t tVar1;
  pointer pcVar2;
  long lVar3;
  opt_t *poVar4;
  long *plVar5;
  size_type *psVar6;
  long *local_48 [2];
  long local_38 [2];
  
  tVar1 = this->type_;
  if (tVar1 == DEFAULT) {
    poVar4 = realopt_t::operator->((realopt_t *)&DAT_0015d868);
    local_48[0] = local_38;
    pcVar2 = (poVar4->yylimit)._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_48,pcVar2,pcVar2 + (poVar4->yylimit)._M_string_length);
    std::__cxx11::string::append((char *)local_48);
    poVar4 = realopt_t::operator->((realopt_t *)&DAT_0015d868);
    plVar5 = (long *)std::__cxx11::string::_M_append
                               ((char *)local_48,(ulong)(poVar4->yycursor)._M_dataplus._M_p);
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    psVar6 = (size_type *)(plVar5 + 2);
    if ((size_type *)*plVar5 == psVar6) {
      lVar3 = plVar5[3];
      (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar6;
      *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar3;
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar5;
      (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar6;
    }
    __return_storage_ptr__->_M_string_length = plVar5[1];
    *plVar5 = (long)psVar6;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
  }
  else {
    expr_lessthan_abi_cxx11_(__return_storage_ptr__,this,1);
  }
  if ((tVar1 == DEFAULT) && (local_48[0] != local_38)) {
    operator_delete(local_48[0],local_38[0] + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string InputAPI::expr_lessthan_one () const
{
	return type_ == DEFAULT
		? opts->yylimit + " <= " + opts->yycursor
		: expr_lessthan (1);
}